

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

void Cipher::translate(TClusterToLetterMap *clMap,TClusters *clusters,
                      vector<int,_std::allocator<int>_> *plain)

{
  size_type sVar1;
  value_type_conflict2 *in_RDX;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *in_RSI;
  int i;
  int iVar2;
  int iVar3;
  value_type_conflict2 *__k;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1b86cd);
  iVar2 = 0;
  while( true ) {
    iVar3 = iVar2;
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)in_RSI);
    if ((int)sVar1 <= iVar2) break;
    __k = in_RDX;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_RSI,(long)iVar3);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at(in_RSI,__k);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar3,iVar2),in_RDX);
    iVar2 = iVar3 + 1;
    in_RDX = __k;
  }
  return;
}

Assistant:

void translate(
            const TClusterToLetterMap & clMap,
            const TClusters & clusters,
            std::vector<TLetter> & plain) {
        plain.clear();
        for (int i = 0; i < (int) clusters.size(); ++i) {
            plain.push_back(clMap.at(clusters[i]));
        }
    }